

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_rebin_wcs(fitsfile *fptr,int naxis,float *amin,float *binsize,int *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double binsized [4];
  double amind [4];
  
  if (*status != 0) {
    return *status;
  }
  uVar1 = 4;
  if (naxis < 4) {
    uVar1 = naxis;
  }
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    amind[uVar3] = (double)amin[uVar3];
    binsized[uVar3] = (double)binsize[uVar3];
  }
  fits_rebin_wcsd(fptr,naxis,amind,binsized,status);
  return *status;
}

Assistant:

int fits_rebin_wcs(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      float *amin,     /* I - first pixel include in each axis        */
      float *binsize,  /* I - binning factor for each axis            */
      int *status)      
{
  double amind[4], binsized[4];

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      binsized[i] = (double) binsize[i];
    }

    fits_rebin_wcsd(fptr, naxis, amind, binsized, status);
  }


  return (*status);
}